

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl-client.c
# Opt level: O0

int lws_ssl_client_bio_create(lws *wsi)

{
  lws_system_blob_t *plVar1;
  int iVar2;
  SSL *pSVar3;
  size_t sVar4;
  BIO *pBVar5;
  size_t sVar6;
  size_t size;
  uint8_t *data;
  lws_system_blob_t *b;
  X509_VERIFY_PARAM *param;
  char *es;
  char **ppcStack_d0;
  int n;
  char *alpn_comma;
  uint8_t openssl_alpn [40];
  char *p;
  char hostname [128];
  lws *wsi_local;
  
  ppcStack_d0 = (char **)(((wsi->a).context)->tls).alpn_default;
  hostname._120_8_ = wsi;
  if (wsi->stash == (client_info_stash *)0x0) {
    iVar2 = lws_hdr_copy(wsi,(char *)&p,0x80,_WSI_TOKEN_CLIENT_HOST);
    if (iVar2 < 1) {
      _lws_log(1,"%s: Unable to get hostname\n","lws_ssl_client_bio_create");
      return -1;
    }
  }
  else {
    lws_strncpy((char *)&p,wsi->stash->cis[2],0x80);
    ppcStack_d0 = *(char ***)(*(long *)(hostname._120_8_ + 0x388) + 0x38);
  }
  for (openssl_alpn._32_8_ = &p; *(char *)openssl_alpn._32_8_ != '\0';
      openssl_alpn._32_8_ = openssl_alpn._32_8_ + 1) {
    if (*(char *)openssl_alpn._32_8_ == ':') {
      *(undefined1 *)openssl_alpn._32_8_ = 0;
      break;
    }
  }
  pSVar3 = SSL_new(*(SSL_CTX **)(*(long *)(hostname._120_8_ + 8) + 0x2c8));
  *(SSL **)(hostname._120_8_ + 1000) = pSVar3;
  if (*(long *)(hostname._120_8_ + 1000) == 0) {
    iVar2 = lws_ssl_get_error((lws *)hostname._120_8_,0);
    param = (X509_VERIFY_PARAM *)ERR_error_string((long)iVar2,(char *)0x0);
    _lws_log(1,"SSL_new failed: %s\n",param);
    lws_tls_err_describe_clear();
    return -1;
  }
  if ((*(ulong *)(*(long *)(hostname._120_8_ + 8) + 0x1d8) & 0x8000000000) == 0) {
    lws_tls_reuse_session((lws *)hostname._120_8_);
  }
  if (*(int *)(*(long *)(hostname._120_8_ + 8) + 0x328) != 0) {
    SSL_set_info_callback(*(SSL **)(hostname._120_8_ + 1000),lws_ssl_info_callback);
  }
  if ((*(uint *)(hostname._120_8_ + 0x430) & 4) == 0) {
    b = (lws_system_blob_t *)SSL_get0_param(*(undefined8 *)(hostname._120_8_ + 1000));
    X509_VERIFY_PARAM_set_hostflags(b,4);
    iVar2 = X509_VERIFY_PARAM_set1_ip_asc(b,&p);
    plVar1 = b;
    if (iVar2 == 0) {
      sVar4 = strnlen((char *)&p,0x80);
      X509_VERIFY_PARAM_set1_host(plVar1,&p,sVar4);
    }
  }
  SSL_set_verify(*(SSL **)(hostname._120_8_ + 1000),1,OpenSSL_client_verify_callback);
  SSL_ctrl(*(SSL **)(hostname._120_8_ + 1000),0x21,2,(void *)0x0);
  SSL_ctrl(*(SSL **)(hostname._120_8_ + 1000),0x37,0,&p);
  pBVar5 = BIO_new_socket(*(int *)(hostname._120_8_ + 0x450),0);
  *(BIO **)(hostname._120_8_ + 0x3f0) = pBVar5;
  SSL_set_bio(*(SSL **)(hostname._120_8_ + 1000),*(BIO **)(hostname._120_8_ + 0x3f0),
              *(BIO **)(hostname._120_8_ + 0x3f0));
  BIO_ctrl(*(BIO **)(hostname._120_8_ + 0x3f0),0x66,1,(void *)0x0);
  if (*(long *)(*(long *)(hostname._120_8_ + 8) + 0x2d8) != 0) {
    ppcStack_d0 = *(char ***)(*(long *)(hostname._120_8_ + 8) + 0x2d8);
  }
  if (*(long *)(hostname._120_8_ + 0x388) != 0) {
    ppcStack_d0 = *(char ***)(*(long *)(hostname._120_8_ + 0x388) + 0x38);
  }
  iVar2 = lws_hdr_copy((lws *)hostname._120_8_,(char *)&p,0x80,_WSI_TOKEN_CLIENT_ALPN);
  if (0 < iVar2) {
    ppcStack_d0 = &p;
  }
  _lws_log(8,"%s client conn using alpn list \'%s\'\n",**(undefined8 **)(hostname._120_8_ + 0x360),
           ppcStack_d0);
  es._4_4_ = lws_alpn_comma_to_openssl((char *)ppcStack_d0,(uint8_t *)&alpn_comma,0x27);
  SSL_set_alpn_protos(*(undefined8 *)(hostname._120_8_ + 1000),&alpn_comma,es._4_4_);
  SSL_set_ex_data(*(SSL **)(hostname._120_8_ + 1000),openssl_websocket_private_data_index,
                  (void *)hostname._120_8_);
  if (*(char *)(hostname._120_8_ + 0x48d) == '\0') {
LAB_0015314e:
    wsi_local._4_4_ = 0;
  }
  else {
    data = (uint8_t *)
           lws_system_get_blob(*(lws_context **)hostname._120_8_,LWS_SYSBLOB_TYPE_CLIENT_CERT_DER,
                               *(byte *)(hostname._120_8_ + 0x48d) - 1);
    if ((((lws_system_blob_t *)data != (lws_system_blob_t *)0x0) &&
        (sVar6 = lws_system_blob_get_size((lws_system_blob_t *)data), sVar6 != 0)) &&
       (iVar2 = lws_system_blob_get_single_ptr((lws_system_blob_t *)data,(uint8_t **)&size),
       iVar2 == 0)) {
      iVar2 = SSL_use_certificate_ASN1(*(SSL **)(hostname._120_8_ + 1000),(uchar *)size,(int)sVar6);
      if (iVar2 == 1) {
        data = (uint8_t *)
               lws_system_get_blob(*(lws_context **)hostname._120_8_,LWS_SYSBLOB_TYPE_CLIENT_KEY_DER
                                   ,*(byte *)(hostname._120_8_ + 0x48d) - 1);
        if ((((lws_system_blob_t *)data != (lws_system_blob_t *)0x0) &&
            (sVar6 = lws_system_blob_get_size((lws_system_blob_t *)data), sVar6 != 0)) &&
           (iVar2 = lws_system_blob_get_single_ptr((lws_system_blob_t *)data,(uint8_t **)&size),
           iVar2 == 0)) {
          iVar2 = SSL_use_PrivateKey_ASN1
                            (6,*(SSL **)(hostname._120_8_ + 1000),(uchar *)size,(long)(int)sVar6);
          if ((iVar2 == 1) ||
             (iVar2 = SSL_use_PrivateKey_ASN1
                                (0x198,*(SSL **)(hostname._120_8_ + 1000),(uchar *)size,
                                 (long)(int)sVar6), iVar2 == 1)) {
            iVar2 = SSL_check_private_key(*(SSL **)(hostname._120_8_ + 1000));
            if (iVar2 != 1) {
              _lws_log(1,"Private SSL key doesn\'t match cert\n");
              lws_tls_err_describe_clear();
              return 1;
            }
            _lws_log(4,"%s: set system client cert %u\n","lws_ssl_client_bio_create",
                     (ulong)(*(byte *)(hostname._120_8_ + 0x48d) - 1));
            goto LAB_0015314e;
          }
          _lws_log(1,"%s: use_privkey failed\n","lws_ssl_client_bio_create");
          lws_tls_err_describe_clear();
        }
      }
      else {
        _lws_log(1,"%s: use_certificate failed\n","lws_ssl_client_bio_create");
        lws_tls_err_describe_clear();
      }
    }
    _lws_log(1,"%s: unable to set up system client cert %d\n","lws_ssl_client_bio_create",
             (ulong)(*(byte *)(hostname._120_8_ + 0x48d) - 1));
    wsi_local._4_4_ = 1;
  }
  return wsi_local._4_4_;
}

Assistant:

int
lws_ssl_client_bio_create(struct lws *wsi)
{
	char hostname[128], *p;
#if defined(LWS_HAVE_SSL_set_alpn_protos) && \
    defined(LWS_HAVE_SSL_get0_alpn_selected)
	uint8_t openssl_alpn[40];
	const char *alpn_comma = wsi->a.context->tls.alpn_default;
	int n;
#endif

	if (wsi->stash) {
		lws_strncpy(hostname, wsi->stash->cis[CIS_HOST], sizeof(hostname));
#if defined(LWS_HAVE_SSL_set_alpn_protos) && \
    defined(LWS_HAVE_SSL_get0_alpn_selected)
		alpn_comma = wsi->stash->cis[CIS_ALPN];
#endif
	} else {
#if defined(LWS_ROLE_H1) || defined(LWS_ROLE_H2)
		if (lws_hdr_copy(wsi, hostname, sizeof(hostname),
				 _WSI_TOKEN_CLIENT_HOST) <= 0)
#endif
		{
			lwsl_err("%s: Unable to get hostname\n", __func__);

			return -1;
		}
	}

	/*
	 * remove any :port part on the hostname... necessary for network
	 * connection but typical certificates do not contain it
	 */
	p = hostname;
	while (*p) {
		if (*p == ':') {
			*p = '\0';
			break;
		}
		p++;
	}

	wsi->tls.ssl = SSL_new(wsi->a.vhost->tls.ssl_client_ctx);
	if (!wsi->tls.ssl) {
		const char *es = ERR_error_string(
#if defined(LWS_WITH_BORINGSSL)
	(uint32_t)
#else
	(unsigned long)
#endif
	lws_ssl_get_error(wsi, 0), NULL);
		lwsl_err("SSL_new failed: %s\n", es);
		lws_tls_err_describe_clear();
		return -1;
	}

#if defined(LWS_WITH_TLS_SESSIONS)
	if (!(wsi->a.vhost->options & LWS_SERVER_OPTION_DISABLE_TLS_SESSION_CACHE))
		lws_tls_reuse_session(wsi);
#endif

#if defined (LWS_HAVE_SSL_SET_INFO_CALLBACK)
	if (wsi->a.vhost->tls.ssl_info_event_mask)
		SSL_set_info_callback(wsi->tls.ssl, lws_ssl_info_callback);
#endif

#if defined(LWS_HAVE_X509_VERIFY_PARAM_set1_host)
	if (!(wsi->tls.use_ssl & LCCSCF_SKIP_SERVER_CERT_HOSTNAME_CHECK)) {
#if !defined(USE_WOLFSSL)

		X509_VERIFY_PARAM *param = SSL_get0_param(wsi->tls.ssl);

		/* Enable automatic hostname checks */
		X509_VERIFY_PARAM_set_hostflags(param,
					X509_CHECK_FLAG_NO_PARTIAL_WILDCARDS);
		/* Handle the case where the hostname is an IP address */
		if (!X509_VERIFY_PARAM_set1_ip_asc(param, hostname))
			X509_VERIFY_PARAM_set1_host(param, hostname,
					strnlen(hostname, sizeof(hostname)));
#endif

	}
#else
	if (!(wsi->tls.use_ssl & LCCSCF_SKIP_SERVER_CERT_HOSTNAME_CHECK)) {
		lwsl_err("%s: your tls lib is too old to have "
			 "X509_VERIFY_PARAM_set1_host, failing all client tls\n",
			 __func__);
		return -1;
	}
#endif

#if !defined(USE_WOLFSSL)
#ifndef USE_OLD_CYASSL
	/* OpenSSL_client_verify_callback will be called @ SSL_connect() */
	SSL_set_verify(wsi->tls.ssl, SSL_VERIFY_PEER,
		       OpenSSL_client_verify_callback);
#endif
#endif

#if !defined(USE_WOLFSSL)
	SSL_set_mode(wsi->tls.ssl,  SSL_MODE_ACCEPT_MOVING_WRITE_BUFFER);
#endif
	/*
	 * use server name indication (SNI), if supported,
	 * when establishing connection
	 */
#ifdef USE_WOLFSSL
#ifdef USE_OLD_CYASSL
#ifdef CYASSL_SNI_HOST_NAME
	CyaSSL_UseSNI(wsi->tls.ssl, CYASSL_SNI_HOST_NAME, hostname,
		      strlen(hostname));
#endif
#else
#ifdef WOLFSSL_SNI_HOST_NAME
	wolfSSL_UseSNI(wsi->tls.ssl, WOLFSSL_SNI_HOST_NAME, hostname,
		       strlen(hostname));
#endif
#endif
#else
#ifdef SSL_CTRL_SET_TLSEXT_HOSTNAME
	SSL_set_tlsext_host_name(wsi->tls.ssl, hostname);
#endif
#endif

#ifdef USE_WOLFSSL
	/*
	 * wolfSSL/CyaSSL does certificate verification differently
	 * from OpenSSL.
	 * If we should ignore the certificate, we need to set
	 * this before SSL_new and SSL_connect is called.
	 * Otherwise the connect will simply fail with error code -155
	 */
#ifdef USE_OLD_CYASSL
	if (wsi->tls.use_ssl & LCCSCF_ALLOW_SELFSIGNED)
		CyaSSL_set_verify(wsi->tls.ssl, SSL_VERIFY_NONE, NULL);
#else
	if (wsi->tls.use_ssl & LCCSCF_ALLOW_SELFSIGNED)
		wolfSSL_set_verify(wsi->tls.ssl, SSL_VERIFY_NONE, NULL);
#endif
#endif /* USE_WOLFSSL */

	wsi->tls.client_bio = BIO_new_socket((int)(lws_intptr_t)wsi->desc.sockfd,
					     BIO_NOCLOSE);
	SSL_set_bio(wsi->tls.ssl, wsi->tls.client_bio, wsi->tls.client_bio);

#ifdef USE_WOLFSSL
#ifdef USE_OLD_CYASSL
	CyaSSL_set_using_nonblock(wsi->tls.ssl, 1);
#else
	wolfSSL_set_using_nonblock(wsi->tls.ssl, 1);
#endif
#else
	BIO_set_nbio(wsi->tls.client_bio, 1); /* nonblocking */
#endif

#if defined(LWS_HAVE_SSL_set_alpn_protos) && \
    defined(LWS_HAVE_SSL_get0_alpn_selected)
	if (wsi->a.vhost->tls.alpn)
		alpn_comma = wsi->a.vhost->tls.alpn;
	if (wsi->stash)
		alpn_comma = wsi->stash->cis[CIS_ALPN];
#if defined(LWS_ROLE_H1) || defined(LWS_ROLE_H2)
	if (lws_hdr_copy(wsi, hostname, sizeof(hostname),
			 _WSI_TOKEN_CLIENT_ALPN) > 0)
		alpn_comma = hostname;
#endif

	lwsl_info("%s client conn using alpn list '%s'\n", wsi->role_ops->name, alpn_comma);

	n = lws_alpn_comma_to_openssl(alpn_comma, openssl_alpn,
				      sizeof(openssl_alpn) - 1);

	SSL_set_alpn_protos(wsi->tls.ssl, openssl_alpn, (unsigned int)n);
#endif

	SSL_set_ex_data(wsi->tls.ssl, openssl_websocket_private_data_index,
			wsi);

	if (wsi->sys_tls_client_cert) {
		lws_system_blob_t *b = lws_system_get_blob(wsi->a.context,
					LWS_SYSBLOB_TYPE_CLIENT_CERT_DER,
					wsi->sys_tls_client_cert - 1);
		const uint8_t *data;
		size_t size;

		if (!b)
			goto no_client_cert;

		/*
		 * Set up the per-connection client cert
		 */

		size = lws_system_blob_get_size(b);
		if (!size)
			goto no_client_cert;

		if (lws_system_blob_get_single_ptr(b, &data))
			goto no_client_cert;

		if (SSL_use_certificate_ASN1(wsi->tls.ssl,
#if defined(USE_WOLFSSL)
			(unsigned char *)
#endif
					data,
#if defined(LWS_WITH_BORINGSSL)
					(size_t)
#else
					(int)
#endif
					size) != 1) {
			lwsl_err("%s: use_certificate failed\n", __func__);
			lws_tls_err_describe_clear();
			goto no_client_cert;
		}

		b = lws_system_get_blob(wsi->a.context,
					LWS_SYSBLOB_TYPE_CLIENT_KEY_DER,
					wsi->sys_tls_client_cert - 1);
		if (!b)
			goto no_client_cert;

		size = lws_system_blob_get_size(b);
		if (!size)
			goto no_client_cert;

		if (lws_system_blob_get_single_ptr(b, &data))
			goto no_client_cert;

		if (SSL_use_PrivateKey_ASN1(EVP_PKEY_RSA, wsi->tls.ssl,
#if defined(USE_WOLFSSL)
			(unsigned char *)
#endif

					    data,
#if defined(LWS_WITH_BORINGSSL)
					(size_t)
#else
					(int)
#endif
					    size) != 1 &&
		    SSL_use_PrivateKey_ASN1(EVP_PKEY_EC, wsi->tls.ssl,
#if defined(USE_WOLFSSL)
			(unsigned char *)
#endif
					    data,
#if defined(LWS_WITH_BORINGSSL)
					(size_t)
#else
					(int)
#endif
					    size) != 1) {
			lwsl_err("%s: use_privkey failed\n", __func__);
			lws_tls_err_describe_clear();
			goto no_client_cert;
		}

		if (SSL_check_private_key(wsi->tls.ssl) != 1) {
			lwsl_err("Private SSL key doesn't match cert\n");
			lws_tls_err_describe_clear();
			return 1;
		}

		lwsl_notice("%s: set system client cert %u\n", __func__,
				wsi->sys_tls_client_cert - 1);
	}

	return 0;

no_client_cert:
	lwsl_err("%s: unable to set up system client cert %d\n", __func__,
			wsi->sys_tls_client_cert - 1);

	return 1;
}